

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_AM.h
# Opt level: O2

string * __thiscall
BGIP_SolverCreator_AM<JointPolicyPureVector>::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_SolverCreator_AM<JointPolicyPureVector> *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BGIPSC_AltMax_nrSol");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"_nrRestarts");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrintBrief() const
        {
            std::stringstream ss;
            ss << "BGIPSC_AltMax_nrSol" << _m_nrSolutions
               << "_nrRestarts" << _m_nrRestarts;
            return(ss.str());
        }